

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

int isSelectionEvent(Display *display,XEvent *event,XPointer pointer)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((event->xany).window == _glfw.x11.helperWindowHandle) {
    if ((event->type & 0xfffffffeU) == 0x1e) {
      return 1;
    }
    uVar1 = (uint)(event->type == 0x1d);
  }
  return uVar1;
}

Assistant:

static Bool isSelectionEvent(Display* display, XEvent* event, XPointer pointer)
{
    if (event->xany.window != _glfw.x11.helperWindowHandle)
        return False;

    return event->type == SelectionRequest ||
           event->type == SelectionNotify ||
           event->type == SelectionClear;
}